

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt32 * tt_cmap14_variant_chars(TT_CMap cmap,FT_Memory memory,FT_UInt32 variantSelector)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  FT_Byte *pFVar4;
  FT_CMap_Class pFVar5;
  FT_UInt FVar6;
  FT_Error FVar7;
  uint *puVar8;
  FT_UInt32 *pFVar9;
  int iVar10;
  ulong uVar11;
  FT_Byte *p;
  byte *pbVar12;
  uint uVar13;
  uint uVar14;
  FT_UInt32 FVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  byte *pbVar22;
  ulong uVar21;
  
  pFVar4 = cmap->data;
  puVar8 = (uint *)tt_cmap14_find_variant(pFVar4 + 6,variantSelector);
  if (puVar8 != (uint *)0x0) {
    uVar13 = *puVar8;
    uVar20 = puVar8[1];
    uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
    uVar11 = (ulong)uVar13;
    uVar20 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
    uVar21 = (ulong)uVar20;
    if (uVar13 != 0 || uVar20 != 0) {
      if (uVar11 == 0) {
LAB_0015d273:
        pFVar9 = tt_cmap14_get_nondef_chars(cmap,pFVar4 + uVar21,memory);
        return pFVar9;
      }
      if (uVar21 != 0) {
        p = pFVar4 + uVar11;
        uVar13 = *(uint *)(pFVar4 + uVar21);
        uVar13 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18
        ;
        FVar6 = tt_cmap14_def_char_count(p);
        if (uVar13 != 0) {
          if (FVar6 != 0) {
            uVar20 = *(uint *)(pFVar4 + uVar11);
            FVar7 = tt_cmap14_ensure((TT_CMap14)cmap,FVar6 + uVar13 + 1,memory);
            uVar11 = 0;
            if (FVar7 != 0) {
              return (FT_UInt32 *)0x0;
            }
            uVar19 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                     uVar20 << 0x18;
            pFVar5 = cmap[1].cmap.clazz;
            FVar15 = (uint)p[6] | (uint)p[5] << 8 | (uint)p[4] << 0x10;
            uVar16 = (uint)p[7];
            pbVar12 = p + 8;
            uVar17 = (uint)pFVar4[uVar21 + 6] |
                     (uint)pFVar4[uVar21 + 5] << 8 | (uint)pFVar4[uVar21 + 4] << 0x10;
            pbVar22 = pFVar4 + uVar21 + 9;
            uVar20 = 1;
            uVar14 = 1;
            while( true ) {
              while (iVar10 = (int)uVar11, uVar17 <= uVar16 + FVar15) {
                if (uVar17 < FVar15) {
                  uVar11 = (ulong)(iVar10 + 1);
                  *(uint *)((long)&pFVar5->size + (long)iVar10 * 4) = uVar17;
                }
                iVar10 = (int)uVar11;
                uVar14 = uVar14 + 1;
                if (uVar13 < uVar14) goto LAB_0015d2c4;
                bVar3 = *pbVar22;
                pbVar1 = pbVar22 + 1;
                pbVar2 = pbVar22 + 2;
                pbVar22 = pbVar22 + 5;
                uVar17 = (uint)*pbVar2 | (uint)*pbVar1 << 8 | (uint)bVar3 << 0x10;
              }
              lVar18 = 0;
              do {
                *(FT_UInt32 *)((long)&pFVar5->size + lVar18 * 4 + (long)iVar10 * 4) =
                     FVar15 + (int)lVar18;
                lVar18 = lVar18 + 1;
              } while (uVar16 + 1 != (int)lVar18);
              uVar20 = uVar20 + 1;
              if (uVar19 < uVar20) break;
              uVar11 = (uVar11 & 0xffffffff) + lVar18;
              FVar15 = (uint)pbVar12[2] | (uint)pbVar12[1] << 8 | (uint)*pbVar12 << 0x10;
              uVar16 = (uint)pbVar12[3];
              pbVar12 = pbVar12 + 4;
            }
            iVar10 = iVar10 + (int)lVar18;
LAB_0015d2c4:
            if (uVar13 < uVar14) {
              if (uVar20 <= uVar19) {
                lVar18 = (long)iVar10;
                uVar13 = 0;
                do {
                  *(FT_UInt32 *)((long)&pFVar5->size + lVar18 * 4) = FVar15;
                  lVar18 = lVar18 + 1;
                  uVar13 = uVar13 - 1;
                  FVar15 = FVar15 + 1;
                } while (~uVar16 != uVar13);
                if (uVar20 < uVar19) {
                  do {
                    FVar15 = (uint)pbVar12[2] | (uint)pbVar12[1] << 8 | (uint)*pbVar12 << 0x10;
                    bVar3 = pbVar12[3];
                    iVar10 = (int)lVar18;
                    lVar18 = (long)iVar10;
                    uVar13 = 0;
                    do {
                      *(FT_UInt32 *)((long)&pFVar5->size + lVar18 * 4) = FVar15;
                      lVar18 = lVar18 + 1;
                      uVar13 = uVar13 - 1;
                      FVar15 = FVar15 + 1;
                    } while (~(uint)bVar3 != uVar13);
                    pbVar12 = pbVar12 + 4;
                    uVar20 = uVar20 + 1;
                  } while (uVar20 < uVar19);
                  iVar10 = iVar10 - uVar13;
                }
                else {
                  iVar10 = iVar10 - uVar13;
                }
              }
            }
            else {
              *(uint *)((long)&pFVar5->size + (long)iVar10 * 4) = uVar17;
              iVar10 = iVar10 + 1;
              if (uVar14 < uVar13) {
                pFVar9 = (FT_UInt32 *)((long)&pFVar5->size + (long)iVar10 * 4);
                do {
                  *pFVar9 = (uint)pbVar22[2] | (uint)pbVar22[1] << 8 | (uint)*pbVar22 << 0x10;
                  pbVar22 = pbVar22 + 5;
                  uVar14 = uVar14 + 1;
                  pFVar9 = pFVar9 + 1;
                  iVar10 = iVar10 + 1;
                } while (uVar14 < uVar13);
              }
            }
            *(FT_UInt32 *)((long)&pFVar5->size + (long)iVar10 * 4) = 0;
            return (FT_UInt32 *)pFVar5;
          }
          goto LAB_0015d273;
        }
      }
      pFVar9 = tt_cmap14_get_def_chars(cmap,pFVar4 + uVar11,memory);
      return pFVar9;
    }
  }
  return (FT_UInt32 *)0x0;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt32 * )
  tt_cmap14_variant_chars( TT_CMap    cmap,
                           FT_Memory  memory,
                           FT_UInt32  variantSelector )
  {
    FT_Byte    *p  = tt_cmap14_find_variant( cmap->data + 6,
                                             variantSelector );
    FT_Int      i;
    FT_ULong    defOff;
    FT_ULong    nondefOff;


    if ( !p )
      return NULL;

    defOff    = TT_NEXT_ULONG( p );
    nondefOff = TT_NEXT_ULONG( p );

    if ( defOff == 0 && nondefOff == 0 )
      return NULL;

    if ( defOff == 0 )
      return tt_cmap14_get_nondef_chars( cmap, cmap->data + nondefOff,
                                         memory );
    else if ( nondefOff == 0 )
      return tt_cmap14_get_def_chars( cmap, cmap->data + defOff,
                                      memory );
    else
    {
      /* Both a default and a non-default glyph set?  That's probably not */
      /* good font design, but the spec allows for it...                  */
      TT_CMap14  cmap14 = (TT_CMap14) cmap;
      FT_UInt32  numRanges;
      FT_UInt32  numMappings;
      FT_UInt32  duni;
      FT_UInt32  dcnt;
      FT_UInt32  nuni;
      FT_Byte*   dp;
      FT_UInt    di, ni, k;

      FT_UInt32  *ret;


      p  = cmap->data + nondefOff;
      dp = cmap->data + defOff;

      numMappings = (FT_UInt32)TT_NEXT_ULONG( p );
      dcnt        = tt_cmap14_def_char_count( dp );
      numRanges   = (FT_UInt32)TT_NEXT_ULONG( dp );

      if ( numMappings == 0 )
        return tt_cmap14_get_def_chars( cmap, cmap->data + defOff,
                                        memory );
      if ( dcnt == 0 )
        return tt_cmap14_get_nondef_chars( cmap, cmap->data + nondefOff,
                                           memory );

      if ( tt_cmap14_ensure( cmap14, ( dcnt + numMappings + 1 ), memory ) )
        return NULL;

      ret  = cmap14->results;
      duni = (FT_UInt32)TT_NEXT_UINT24( dp );
      dcnt = FT_NEXT_BYTE( dp );
      di   = 1;
      nuni = (FT_UInt32)TT_NEXT_UINT24( p );
      p   += 2;
      ni   = 1;
      i    = 0;

      for (;;)
      {
        if ( nuni > duni + dcnt )
        {
          for ( k = 0; k <= dcnt; k++ )
            ret[i++] = duni + k;

          di++;

          if ( di > numRanges )
            break;

          duni = (FT_UInt32)TT_NEXT_UINT24( dp );
          dcnt = FT_NEXT_BYTE( dp );
        }
        else
        {
          if ( nuni < duni )
            ret[i++] = nuni;
          /* If it is within the default range then ignore it -- */
          /* that should not have happened                       */
          ni++;
          if ( ni > numMappings )
            break;

          nuni = (FT_UInt32)TT_NEXT_UINT24( p );
          p += 2;
        }
      }

      if ( ni <= numMappings )
      {
        /* If we get here then we have run out of all default ranges.   */
        /* We have read one non-default mapping which we haven't stored */
        /* and there may be others that need to be read.                */
        ret[i++] = nuni;
        while ( ni < numMappings )
        {
          ret[i++] = (FT_UInt32)TT_NEXT_UINT24( p );
          p += 2;
          ni++;
        }
      }
      else if ( di <= numRanges )
      {
        /* If we get here then we have run out of all non-default     */
        /* mappings.  We have read one default range which we haven't */
        /* stored and there may be others that need to be read.       */
        for ( k = 0; k <= dcnt; k++ )
          ret[i++] = duni + k;

        while ( di < numRanges )
        {
          duni = (FT_UInt32)TT_NEXT_UINT24( dp );
          dcnt = FT_NEXT_BYTE( dp );

          for ( k = 0; k <= dcnt; k++ )
            ret[i++] = duni + k;
          di++;
        }
      }

      ret[i] = 0;

      return ret;
    }
  }